

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O1

long ov_read_filter(OggVorbis_File *vf,char *buffer,int length,int bigendianp,int word,int sgned,
                   int *bitstream,_func_void_float_ptr_ptr_long_long_void_ptr *filter,
                   void *filter_param)

{
  uint uVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  vorbis_info *pvVar5;
  long lVar6;
  int extraout_EDX;
  ulong extraout_RDX;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  short *psVar11;
  long lVar12;
  long lVar13;
  long unaff_R15;
  float **pcm;
  float **local_58;
  int local_4c;
  long local_48;
  int local_3c;
  vorbis_dsp_state *local_38;
  
  uVar8 = (ulong)(uint)length;
  uVar7 = (ulong)(uint)bigendianp;
  if ((word < 1) || (vf->ready_state < 2)) {
LAB_001aac1b:
    unaff_R15 = -0x83;
  }
  else {
    local_48 = CONCAT44(local_48._4_4_,length);
    local_38 = &vf->vd;
    local_4c = sgned;
    local_3c = bigendianp;
    do {
      iVar4 = (int)uVar8;
      if ((vf->ready_state == 4) &&
         (iVar3 = vorbis_synthesis_pcmout(local_38,&local_58), iVar4 = extraout_EDX, iVar3 != 0)) {
        lVar13 = (long)iVar3;
        if (iVar3 < 1) {
          return lVar13;
        }
        if (vf->seekable == 0) {
          pvVar5 = vf->vi;
        }
        else {
          pvVar5 = vf->vi;
          if (2 < vf->ready_state) {
            pvVar5 = pvVar5 + vf->current_link;
          }
        }
        uVar1 = pvVar5->channels;
        lVar12 = (long)(int)uVar1;
        if (0xffffff00 < uVar1 - 0x100) {
          lVar6 = (ulong)(uint)word * lVar12;
          if ((long)(int)local_48 / lVar6 < lVar13) {
            lVar13 = (long)(int)local_48 / lVar6;
          }
          if (lVar13 < 1) {
            return -0x83;
          }
          uVar8 = (ulong)uVar1;
          local_48 = lVar6;
          if (filter != (_func_void_float_ptr_ptr_long_long_void_ptr *)0x0) {
            (*filter)(local_58,lVar12,lVar13,filter_param);
          }
          if (word == 1) {
            lVar12 = 1;
            if (1 < lVar13) {
              lVar12 = lVar13;
            }
            lVar6 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar8 = 0;
                do {
                  iVar4 = (int)ROUND(local_58[uVar8][lVar6] * 128.0);
                  if (iVar4 < -0x7f) {
                    iVar4 = -0x80;
                  }
                  if (0x7e < iVar4) {
                    iVar4 = 0x7f;
                  }
                  buffer[uVar8] = (char)iVar4 + (local_4c == 0) * -0x80;
                  uVar8 = uVar8 + 1;
                } while (uVar1 != uVar8);
                buffer = buffer + uVar8;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 != lVar12);
          }
          else {
            iVar4 = (uint)(local_4c == 0) * 0x8000;
            if (local_3c == 0) {
              if (local_4c == 0) {
                if (0 < (int)uVar1) {
                  lVar6 = 1;
                  if (1 < lVar13) {
                    lVar6 = lVar13;
                  }
                  uVar7 = 0;
                  do {
                    pfVar2 = local_58[uVar7];
                    lVar9 = 0;
                    psVar11 = (short *)buffer;
                    do {
                      iVar3 = (int)ROUND(pfVar2[lVar9] * 32768.0);
                      if (iVar3 < -0x7fff) {
                        iVar3 = -0x8000;
                      }
                      if (0x7ffe < iVar3) {
                        iVar3 = 0x7fff;
                      }
                      *psVar11 = (short)iVar3 + (short)iVar4;
                      lVar9 = lVar9 + 1;
                      psVar11 = psVar11 + lVar12;
                    } while (lVar6 != lVar9);
                    uVar7 = uVar7 + 1;
                    buffer = (char *)((long)buffer + 2);
                  } while (uVar7 != uVar8);
                }
              }
              else if (0 < (int)uVar1) {
                lVar6 = 1;
                if (1 < lVar13) {
                  lVar6 = lVar13;
                }
                uVar7 = 0;
                do {
                  pfVar2 = local_58[uVar7];
                  lVar9 = 0;
                  pcVar10 = buffer;
                  do {
                    iVar4 = (int)ROUND(pfVar2[lVar9] * 32768.0);
                    if (iVar4 < -0x7fff) {
                      iVar4 = -0x8000;
                    }
                    if (0x7ffe < iVar4) {
                      iVar4 = 0x7fff;
                    }
                    *(short *)pcVar10 = (short)iVar4;
                    lVar9 = lVar9 + 1;
                    pcVar10 = pcVar10 + lVar12 * 2;
                  } while (lVar6 != lVar9);
                  uVar7 = uVar7 + 1;
                  buffer = buffer + 2;
                } while (uVar7 != uVar8);
              }
            }
            else {
              lVar12 = 1;
              if (1 < lVar13) {
                lVar12 = lVar13;
              }
              lVar6 = 0;
              do {
                if (0 < (int)uVar1) {
                  lVar9 = 0;
                  do {
                    iVar3 = (int)ROUND(*(float *)(*(long *)((long)local_58 + lVar9 * 4) + lVar6 * 4)
                                       * 32768.0);
                    if (iVar3 < -0x7fff) {
                      iVar3 = -0x8000;
                    }
                    if (0x7ffe < iVar3) {
                      iVar3 = 0x7fff;
                    }
                    buffer[lVar9] = (char)((uint)(iVar3 + iVar4) >> 8);
                    buffer[lVar9 + 1] = (char)iVar3;
                    lVar9 = lVar9 + 2;
                  } while (uVar8 * 2 != lVar9);
                  buffer = buffer + lVar9;
                }
                lVar6 = lVar6 + 1;
              } while (lVar6 != lVar12);
            }
          }
          vorbis_synthesis_read(local_38,(int)lVar13);
          iVar4 = vorbis_synthesis_halfrate_p(vf->vi);
          vf->pcm_offset = vf->pcm_offset + (lVar13 << ((byte)iVar4 & 0x3f));
          if (bitstream != (int *)0x0) {
            *bitstream = vf->current_link;
          }
          return lVar13 * local_48;
        }
        goto LAB_001aac1b;
      }
      iVar4 = _fetch_and_process_packet(vf,(ogg_packet *)0x1,iVar4,(int)uVar7);
      if (iVar4 < 1) {
        unaff_R15 = (long)iVar4;
      }
      if (iVar4 == -2) {
        unaff_R15 = 0;
      }
      uVar8 = extraout_RDX;
    } while (0 < iVar4);
  }
  return unaff_R15;
}

Assistant:

long ov_read_filter(OggVorbis_File *vf,char *buffer,int length,
                    int bigendianp,int word,int sgned,int *bitstream,
                    void (*filter)(float **pcm,long channels,long samples,void *filter_param),void *filter_param){
  int i,j;
  int host_endian = host_is_big_endian();
  int hs;

  float **pcm;
  long samples;

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(word<=0)return(OV_EINVAL);

  while(1){
    if(vf->ready_state==INITSET){
      samples=vorbis_synthesis_pcmout(&vf->vd,&pcm);
      if(samples)break;
    }

    /* suck in another packet */
    {
      int ret=_fetch_and_process_packet(vf,NULL,1,1);
      if(ret==OV_EOF)
        return(0);
      if(ret<=0)
        return(ret);
    }

  }

  if(samples>0){

    /* yay! proceed to pack data into the byte buffer */

    long channels=ov_info(vf,-1)->channels;
    long bytespersample=word * channels;
    vorbis_fpu_control fpu;

    if(channels<1||channels>255)return(OV_EINVAL);
    if(samples>length/bytespersample)samples=length/bytespersample;

    if(samples <= 0)
      return OV_EINVAL;

    /* Here. */
    if(filter)
      filter(pcm,channels,samples,filter_param);

    /* a tight loop to pack each size */
    {
      int val;
      if(word==1){
        int off=(sgned?0:128);
        vorbis_fpu_setround(&fpu);
        for(j=0;j<samples;j++)
          for(i=0;i<channels;i++){
            val=vorbis_ftoi(pcm[i][j]*128.f);
            if(val>127)val=127;
            else if(val<-128)val=-128;
            *buffer++=val+off;
          }
        vorbis_fpu_restore(fpu);
      }else{
        int off=(sgned?0:32768);

        if(host_endian==bigendianp){
          if(sgned){

            vorbis_fpu_setround(&fpu);
            for(i=0;i<channels;i++) { /* It's faster in this order */
              float *src=pcm[i];
              short *dest=((short *)buffer)+i;
              for(j=0;j<samples;j++) {
                val=vorbis_ftoi(src[j]*32768.f);
                if(val>32767)val=32767;
                else if(val<-32768)val=-32768;
                *dest=val;
                dest+=channels;
              }
            }
            vorbis_fpu_restore(fpu);

          }else{

            vorbis_fpu_setround(&fpu);
            for(i=0;i<channels;i++) {
              float *src=pcm[i];
              short *dest=((short *)buffer)+i;
              for(j=0;j<samples;j++) {
                val=vorbis_ftoi(src[j]*32768.f);
                if(val>32767)val=32767;
                else if(val<-32768)val=-32768;
                *dest=val+off;
                dest+=channels;
              }
            }
            vorbis_fpu_restore(fpu);

          }
        }else if(bigendianp){

          vorbis_fpu_setround(&fpu);
          for(j=0;j<samples;j++)
            for(i=0;i<channels;i++){
              val=vorbis_ftoi(pcm[i][j]*32768.f);
              if(val>32767)val=32767;
              else if(val<-32768)val=-32768;
              val+=off;
              *buffer++=(val>>8);
              *buffer++=(val&0xff);
            }
          vorbis_fpu_restore(fpu);

        }else{
          int val;
          vorbis_fpu_setround(&fpu);
          for(j=0;j<samples;j++)
            for(i=0;i<channels;i++){
              val=vorbis_ftoi(pcm[i][j]*32768.f);
              if(val>32767)val=32767;
              else if(val<-32768)val=-32768;
              val+=off;
              *buffer++=(val&0xff);
              *buffer++=(val>>8);
                  }
          vorbis_fpu_restore(fpu);

        }
      }
    }

    vorbis_synthesis_read(&vf->vd,samples);
    hs=vorbis_synthesis_halfrate_p(vf->vi);
    vf->pcm_offset+=(samples<<hs);
    if(bitstream)*bitstream=vf->current_link;
    return(samples*bytespersample);
  }else{
    return(samples);
  }
}